

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O2

void __thiscall
draco::RAnsSymbolEncoder<8>::EndEncoding(RAnsSymbolEncoder<8> *this,EncoderBuffer *buffer)

{
  uint64_t uVar1;
  int iVar2;
  unsigned_long val;
  ulong __n;
  pointer pcVar3;
  EncoderBuffer var_size_buffer;
  EncoderBuffer local_60;
  
  pcVar3 = (buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = this->buffer_offset_;
  iVar2 = RAnsEncoder<12>::write_end(&this->ans_);
  val = (unsigned_long)iVar2;
  EncoderBuffer::EncoderBuffer(&local_60);
  EncodeVarint<unsigned_long>(val,&local_60);
  pcVar3 = pcVar3 + uVar1;
  __n = (ulong)(uint)((int)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (int)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  memmove(pcVar3 + __n,pcVar3,val);
  memcpy(pcVar3,local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,__n);
  EncoderBuffer::Resize(buffer,__n + val + this->buffer_offset_);
  EncoderBuffer::~EncoderBuffer(&local_60);
  return;
}

Assistant:

void RAnsSymbolEncoder<unique_symbols_bit_length_t>::EndEncoding(
    EncoderBuffer *buffer) {
  char *const src = const_cast<char *>(buffer->data()) + buffer_offset_;

  // TODO(fgalligan): Look into changing this to uint32_t as write_end()
  // returns an int.
  const uint64_t bytes_written = static_cast<uint64_t>(ans_.write_end());
  EncoderBuffer var_size_buffer;
  EncodeVarint(bytes_written, &var_size_buffer);
  const uint32_t size_len = static_cast<uint32_t>(var_size_buffer.size());
  char *const dst = src + size_len;
  memmove(dst, src, bytes_written);

  // Store the size of the encoded data.
  memcpy(src, var_size_buffer.data(), size_len);

  // Resize the buffer to match the number of encoded bytes.
  buffer->Resize(buffer_offset_ + bytes_written + size_len);
}